

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

void Gia_ObjSimCollect(Gia_SimRsbMan_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  uint uVar6;
  undefined8 uVar7;
  int i;
  Vec_Int_t *p_00;
  
  p->vFanins2->nSize = 0;
  p_00 = p->vFanins;
  iVar1 = p_00->nSize;
  if (0 < iVar1) {
    for (i = 0; i < iVar1; i = i + 1) {
      iVar1 = Vec_IntEntry(p_00,i);
      pGVar5 = Gia_ManObj(p->pGia,iVar1);
      uVar7 = *(undefined8 *)pGVar5;
      uVar6 = (uint)uVar7;
      if ((~uVar6 & 0x1fffffff) != 0 && -1 < (int)uVar6) {
        iVar2 = Gia_ObjIsTravIdCurrentId(p->pGia,iVar1 - (uVar6 & 0x1fffffff));
        uVar7 = *(undefined8 *)pGVar5;
        if (iVar2 == 0) {
          Vec_IntPush(p->vFanins2,iVar1 - ((uint)uVar7 & 0x1fffffff));
          uVar7 = *(undefined8 *)pGVar5;
        }
      }
      if ((~(uint)uVar7 & 0x1fffffff) != 0 && -1 < (int)(uint)uVar7) {
        iVar2 = Gia_ObjIsTravIdCurrentId
                          (p->pGia,iVar1 - ((uint)((ulong)uVar7 >> 0x20) & 0x1fffffff));
        if (iVar2 == 0) {
          Vec_IntPush(p->vFanins2,iVar1 - (*(uint *)&pGVar5->field_0x4 & 0x1fffffff));
        }
      }
      iVar2 = 0;
      while( true ) {
        iVar3 = Gia_ObjFanoutNumId(p->pGia,iVar1);
        if (iVar3 <= iVar2) break;
        iVar3 = Gia_ObjFanoutId(p->pGia,iVar1,iVar2);
        pGVar5 = Gia_ManObj(p->pGia,iVar3);
        if ((~*(uint *)pGVar5 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar5) {
          iVar4 = Gia_ObjIsTravIdCurrentId(p->pGia,iVar3);
          if (iVar4 == 0) {
            Vec_IntPush(p->vFanins2,iVar3);
          }
        }
        iVar2 = iVar2 + 1;
      }
      p_00 = p->vFanins;
      iVar1 = p_00->nSize;
    }
    return;
  }
  __assert_fail("Vec_IntSize(p->vFanins) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                ,0x22a,"void Gia_ObjSimCollect(Gia_SimRsbMan_t *)");
}

Assistant:

void Gia_ObjSimCollect( Gia_SimRsbMan_t * p )
{
    int i, k, iTemp, iFanout;
    Vec_IntClear( p->vFanins2 );
    assert( Vec_IntSize(p->vFanins) > 0 );
    Vec_IntForEachEntry( p->vFanins, iTemp, i )
    {
        Gia_Obj_t * pObj = Gia_ManObj( p->pGia, iTemp );
        if ( Gia_ObjIsAnd(pObj) && !Gia_ObjIsTravIdCurrentId( p->pGia, Gia_ObjFaninId0(pObj, iTemp) ) )
            Vec_IntPush( p->vFanins2, Gia_ObjFaninId0(pObj, iTemp) );
        if ( Gia_ObjIsAnd(pObj) && !Gia_ObjIsTravIdCurrentId( p->pGia, Gia_ObjFaninId1(pObj, iTemp) ) )
            Vec_IntPush( p->vFanins2, Gia_ObjFaninId1(pObj, iTemp) );
        Gia_ObjForEachFanoutStaticId( p->pGia, iTemp, iFanout, k )
            if ( Gia_ObjIsAnd(Gia_ManObj(p->pGia, iFanout)) && !Gia_ObjIsTravIdCurrentId( p->pGia, iFanout ) )
                Vec_IntPush( p->vFanins2, iFanout );
    }
}